

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O1

void __thiscall I2cAnalyzer::WorkerThread(I2cAnalyzer *this)

{
  AnalyzerChannelData *pAVar1;
  U32 UVar2;
  
  UVar2 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar2;
  this->mNeedAddress = true;
  pAVar1 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSda = pAVar1;
  pAVar1 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mScl = pAVar1;
  AdvanceToStartBit(this);
  AnalyzerChannelData::AdvanceToNextEdge();
  do {
    GetByte(this);
    Analyzer::CheckIfThreadShouldExit();
  } while( true );
}

Assistant:

void I2cAnalyzer::WorkerThread()
{
    mSampleRateHz = GetSampleRate();
    mNeedAddress = true;

    mSda = GetAnalyzerChannelData( mSettings->mSdaChannel );
    mScl = GetAnalyzerChannelData( mSettings->mSclChannel );

    AdvanceToStartBit();
    mScl->AdvanceToNextEdge(); // now scl is low.

    for( ;; )
    {
        GetByte();
        CheckIfThreadShouldExit();
    }
}